

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

FT_F26Dot6 Round_To_Half_Grid(TT_ExecContext exc,FT_F26Dot6 distance,FT_F26Dot6 compensation)

{
  ulong uVar1;
  ulong uVar2;
  
  if (distance < 0) {
    uVar2 = compensation - distance & 0xffffffffffffffc0;
    uVar1 = 0xffffffffffffffe0;
    if (-0x21 < (long)uVar2) {
      uVar1 = uVar2 ^ 0xffffffffffffffe0;
    }
  }
  else {
    uVar1 = 0x20;
    if (-1 < compensation + distance) {
      uVar1 = compensation + distance & 0xffffffffffffffc0U | 0x20;
    }
  }
  return uVar1;
}

Assistant:

static FT_F26Dot6
  Round_To_Half_Grid( TT_ExecContext  exc,
                      FT_F26Dot6      distance,
                      FT_F26Dot6      compensation )
  {
    FT_F26Dot6  val;

    FT_UNUSED( exc );


    if ( distance >= 0 )
    {
      val = ADD_LONG( FT_PIX_FLOOR( ADD_LONG( distance, compensation ) ),
                      32 );
      if ( val < 0 )
        val = 32;
    }
    else
    {
      val = NEG_LONG( ADD_LONG( FT_PIX_FLOOR( SUB_LONG( compensation,
                                                        distance ) ),
                                32 ) );
      if ( val > 0 )
        val = -32;
    }

    return val;
  }